

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O0

void Abs_ManSimInfoSet(Vec_Ptr_t *vSimInfo,Aig_Obj_t *pObj,int iFrame,int Value)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  uint *pInfo;
  int Value_local;
  int iFrame_local;
  Aig_Obj_t *pObj_local;
  Vec_Ptr_t *vSimInfo_local;
  
  pvVar4 = Vec_PtrEntry(vSimInfo,iFrame);
  if ((0 < Value) && (Value < 4)) {
    uVar1 = Abs_ManSimInfoGet(vSimInfo,pObj,iFrame);
    uVar2 = Aig_ObjId(pObj);
    iVar3 = Aig_ObjId(pObj);
    *(uint *)((long)pvVar4 + (long)(iVar3 >> 4) * 4) =
         (uVar1 ^ Value) << (sbyte)((uVar2 & 0xf) << 1) ^
         *(uint *)((long)pvVar4 + (long)(iVar3 >> 4) * 4);
    return;
  }
  __assert_fail("Value >= ABS_ZER && Value <= ABS_UND",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc2.c"
                ,0x8a,"void Abs_ManSimInfoSet(Vec_Ptr_t *, Aig_Obj_t *, int, int)");
}

Assistant:

static inline void Abs_ManSimInfoSet( Vec_Ptr_t * vSimInfo, Aig_Obj_t * pObj, int iFrame, int Value )
{
    unsigned * pInfo = (unsigned *)Vec_PtrEntry( vSimInfo, iFrame );
    assert( Value >= ABS_ZER && Value <= ABS_UND );
    Value ^= Abs_ManSimInfoGet( vSimInfo, pObj, iFrame );
    pInfo[Aig_ObjId(pObj) >> 4] ^= (Value << ((Aig_ObjId(pObj) & 15) << 1));
}